

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O3

void __thiscall Dense::~Dense(Dense *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR_forward_00129840;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Object deconstructed!",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  pcVar2 = (this->type)._M_dataplus._M_p;
  paVar1 = &(this->type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  free((this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  free((this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  free((this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free((this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

Dense::~Dense() {
    cout << "Object deconstructed!" << endl;
}